

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Maybe<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_> * __thiscall
kj::Maybe<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>::operator=
          (Maybe<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_> *this,
          Maybe<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_> *other)

{
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse> *other_00;
  Maybe<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_> *other_local;
  Maybe<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_> *this_local;
  
  other_00 = mv<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>>
                       (&other->ptr);
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>::operator=
            (&this->ptr,other_00);
  return this;
}

Assistant:

inline Maybe& operator=(Maybe&& other) { ptr = kj::mv(other.ptr); return *this; }